

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_18::FunctionInfoScanner::visitFunction(FunctionInfoScanner *this,Function *curr)

{
  bool bVar1;
  Index IVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  Type *pTVar5;
  Signature SVar6;
  Type local_48;
  Iterator local_40;
  
  pmVar3 = std::
           unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
           ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
                         *)this,(key_type *)curr);
  SVar6 = HeapType::getSignature(&curr->type);
  local_48 = SVar6.params.id;
  local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_48;
  sVar4 = wasm::Type::size(&local_48);
  if (sVar4 != 0) {
    do {
      pTVar5 = wasm::Type::Iterator::operator*(&local_40);
      bVar1 = TypeUpdating::canHandleAsLocal((Type)pTVar5->id);
      if (!bVar1) {
        pmVar3->inliningMode = Uninlineable;
        break;
      }
      local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 1;
    } while ((local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index !=
              sVar4) ||
            (local_40.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             &local_48));
  }
  IVar2 = Measurer::measure(curr->body);
  pmVar3->size = IVar2;
  if ((curr->body->_id == CallId) && (curr->body[1].type.id + 1 == (ulong)IVar2)) {
    pmVar3->isTrivialCall = true;
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto& info = infos[curr->name];

    if (!canHandleParams(curr)) {
      info.inliningMode = InliningMode::Uninlineable;
    }

    info.size = Measurer::measure(curr->body);

    if (auto* call = curr->body->dynCast<Call>()) {
      if (info.size == call->operands.size() + 1) {
        // This function body is a call with some trivial (size 1) operands like
        // LocalGet or Const, so it is a trivial call.
        info.isTrivialCall = true;
      }
    }
  }